

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# match.h
# Opt level: O2

bool wasm::Match::Internal::
     Components<wasm::Match::Internal::LitKind<wasm::Match::Internal::I64LK>,_0,_wasm::Match::Internal::Matcher<wasm::Match::Internal::ExactKind<long>_>_>
     ::match(matched_t<wasm::Match::Internal::LitKind<wasm::Match::Internal::I64LK>_> *candidate,
            SubMatchers<wasm::Match::Internal::Matcher<wasm::Match::Internal::ExactKind<long>_>_>
            *matchers)

{
  int64_t *piVar1;
  long lVar2;
  int64_t iVar3;
  Literal local_58;
  Literal local_40;
  GetComponent<wasm::Match::Internal::LitKind<wasm::Match::Internal::I64LK>,_0> local_21;
  
  Literal::Literal(&local_40,candidate);
  iVar3 = GetComponent<wasm::Match::Internal::LitKind<wasm::Match::Internal::I64LK>,_0>::operator()
                    (&local_21,&local_40);
  piVar1 = (matchers->curr).binder;
  if (piVar1 != (int64_t *)0x0) {
    *piVar1 = iVar3;
  }
  lVar2 = (matchers->curr).data;
  if (lVar2 == iVar3) {
    Literal::Literal(&local_58,candidate);
    Literal::~Literal(&local_58);
  }
  Literal::~Literal(&local_40);
  return lVar2 == iVar3;
}

Assistant:

static inline bool
  match(matched_t<Kind> candidate,
        SubMatchers<CurrMatcher, NextMatchers...>& matchers) {
    return matchers.curr.matches(GetComponent<Kind, pos>{}(candidate)) &&
           Components<Kind, pos + 1, NextMatchers...>::match(candidate,
                                                             matchers.next);
  }